

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O1

void __thiscall Chip8::OP_1NNN(Chip8 *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"JP 0x0",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"                 ; Jump to location",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Chip8::OP_1NNN() {
    std::cout << "JP 0x0"  << (opcode & 0x0FFFu) << "                 ; Jump to location" << std::endl;
}